

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cpp
# Opt level: O0

bool vera::loadPLY(string *_filename,Scene *_scene,bool _verbose)

{
  mapped_type pMVar1;
  value_type vVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  DrawMode DVar8;
  char *pcVar9;
  Material *this;
  mapped_type *ppMVar10;
  istream *piVar11;
  long lVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  size_type sVar17;
  Model *this_00;
  mapped_type *ppMVar18;
  ostream *poVar19;
  int local_91c;
  value_type local_918;
  int local_914;
  int i;
  int numV;
  stringstream sline_1;
  value_type local_788;
  vec2 uv;
  undefined8 local_778;
  float local_770;
  float local_76c;
  float a;
  float b;
  float g;
  float r;
  vec4 c;
  vec3 n;
  vec3 v;
  stringstream sline;
  string local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  string local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  string local_4f0;
  string local_4d0;
  undefined1 local_4b0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texcoord;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vertices;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  colors;
  string name;
  int local_410;
  int lineNum;
  State state;
  uint uStack_404;
  bool floatColor;
  int currentFace;
  int currentVertex;
  int normalsCoordsFound;
  int texCoordsFound;
  int colorCompsFound;
  int vertexCoordsFound;
  int orderIndices;
  int orderVertices;
  string error;
  string line;
  Mesh mesh;
  key_type local_2f8;
  mapped_type local_2d8;
  Material *default_material;
  key_type local_2c8;
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0;
  _Self local_280;
  allocator local_271;
  key_type local_270;
  _Self local_250 [3];
  istream local_238 [8];
  fstream is;
  bool _verbose_local;
  Scene *_scene_local;
  string *_filename_local;
  
  pcVar9 = (char *)std::__cxx11::string::c_str();
  std::fstream::fstream(local_238,pcVar9,_S_in);
  bVar4 = std::fstream::is_open();
  if ((bVar4 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,"default",&local_271);
    local_250[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
         ::find(&_scene->materials,&local_270);
    local_280._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
         ::end(&_scene->materials);
    bVar5 = std::operator==(local_250,&local_280);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    if (bVar5) {
      this = (Material *)operator_new(0x150);
      local_2a2 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2a0,"default",&local_2a1);
      Material::Material(this,&local_2a0);
      local_2a2 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2c8,"default",(allocator *)((long)&default_material + 7));
      ppMVar10 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::operator[](&_scene->materials,&local_2c8);
      *ppMVar10 = this;
      std::__cxx11::string::~string((string *)&local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&default_material + 7));
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2f8,"default",(allocator *)((long)&mesh.m_material + 7));
    ppMVar10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
               ::operator[](&_scene->materials,&local_2f8);
    pMVar1 = *ppMVar10;
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&mesh.m_material + 7));
    local_2d8 = pMVar1;
    Mesh::Mesh((Mesh *)((long)&line.field_2 + 8));
    std::__cxx11::string::string((string *)(error.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&orderIndices);
    vertexCoordsFound = -1;
    colorCompsFound = -1;
    texCoordsFound = 0;
    normalsCoordsFound = 0;
    currentVertex = 0;
    currentFace = 0;
    uStack_404 = 0;
    state = Header;
    bVar5 = false;
    local_410 = 0;
    std::__cxx11::string::string
              ((string *)
               &colors.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
              *)&vertices.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&normals.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&texcoord.
                 super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              *)&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4b0);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (local_238,(string *)(error.field_2._M_local_buf + 8));
    name.field_2._12_4_ = 1;
    bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&error.field_2 + 8),"ply");
    if (bVar6) {
      std::__cxx11::string::operator=((string *)&orderIndices,"wrong format, expecting \'ply\'");
LAB_0058c737:
      poVar19 = std::operator<<((ostream *)&std::cout,"ERROR glMesh, load(): ");
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,name.field_2._12_4_);
      poVar19 = std::operator<<(poVar19,":");
      poVar19 = std::operator<<(poVar19,(string *)&orderIndices);
      std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
      poVar19 = std::operator<<((ostream *)&std::cout,"ERROR glMesh, load(): \"");
      poVar19 = std::operator<<(poVar19,(string *)(error.field_2._M_local_buf + 8));
      poVar19 = std::operator<<(poVar19,"\"");
      std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
      local_91c = 0;
    }
    else {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_238,(string *)(error.field_2._M_local_buf + 8));
      name.field_2._12_4_ = 2;
      bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&error.field_2 + 8),"format ascii 1.0");
      iVar3 = 2;
      if (bVar6) {
        std::__cxx11::string::operator=
                  ((string *)&orderIndices,"wrong format, expecting \'format ascii 1.0\'");
        goto LAB_0058c737;
      }
      do {
        do {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        while( true ) {
                          while( true ) {
                            while( true ) {
                              do {
                                name.field_2._12_4_ = iVar3;
                                piVar11 = std::
                                          getline<char,std::char_traits<char>,std::allocator<char>>
                                                    (local_238,
                                                     (string *)(error.field_2._M_local_buf + 8));
                                bVar6 = std::ios::operator_cast_to_bool
                                                  ((ios *)(piVar11 +
                                                          *(long *)(*(long *)piVar11 + -0x18)));
                                if (!bVar6) {
                                  std::fstream::close();
                                  Mesh::addColors((Mesh *)((long)&line.field_2 + 8),
                                                  (
                                                  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                                  *)&vertices.
                                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 );
                                  Mesh::addVertices((Mesh *)((long)&line.field_2 + 8),
                                                    (
                                                  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  *)&normals.
                                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                  Mesh::addTexCoords((Mesh *)((long)&line.field_2 + 8),
                                                     (
                                                  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                                  *)&indices.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                  sVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>
                                           ::size((
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)local_4b0);
                                  if (sVar17 == 0) {
                                    Mesh::setDrawMode((Mesh *)((long)&line.field_2 + 8),POINTS);
                                  }
                                  else {
                                    Mesh::addIndices((Mesh *)((long)&line.field_2 + 8),
                                                     (
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)local_4b0);
                                  }
                                  sVar17 = std::
                                           vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           ::size((
                                                  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  *)&texcoord.
                                                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 );
                                  if (sVar17 == 0) {
                                    Mesh::computeNormals((Mesh *)((long)&line.field_2 + 8));
                                  }
                                  else {
                                    Mesh::addNormals((Mesh *)((long)&line.field_2 + 8),
                                                     (
                                                  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                                  *)&texcoord.
                                                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                  }
                                  Mesh::computeTangents((Mesh *)((long)&line.field_2 + 8));
                                  pMVar1 = local_2d8;
                                  ppMVar10 = std::
                                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                                             ::operator[](&_scene->materials,&local_2d8->name);
                                  *ppMVar10 = pMVar1;
                                  DVar8 = Mesh::getDrawMode((Mesh *)((long)&line.field_2 + 8));
                                  if (DVar8 == POINTS) {
                                    std::__cxx11::string::operator=
                                              ((string *)
                                               &colors.
                                                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                               "points");
                                  }
                                  else {
                                    DVar8 = Mesh::getDrawMode((Mesh *)((long)&line.field_2 + 8));
                                    if (DVar8 == LINES) {
                                      std::__cxx11::string::operator=
                                                ((string *)
                                                 &colors.
                                                  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 ,"lines");
                                    }
                                    else {
                                      std::__cxx11::string::operator=
                                                ((string *)
                                                 &colors.
                                                  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 ,"mesh");
                                    }
                                  }
                                  this_00 = (Model *)operator_new(0x2d8);
                                  Model::Model(this_00,(string *)
                                                       &colors.
                                                  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               ,(Mesh *)((long)&line.field_2 + 8),local_2d8);
                                  ppMVar18 = std::
                                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                                             ::operator[](&_scene->models,
                                                          (key_type *)
                                                          &colors.
                                                  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                  *ppMVar18 = this_00;
                                  _filename_local._7_1_ = 1;
                                  local_91c = 1;
                                  goto LAB_0058c82e;
                                }
                                name.field_2._12_4_ = name.field_2._12_4_ + 1;
                                lVar12 = std::__cxx11::string::find
                                                   (error.field_2._M_local_buf + 8,0x60f40a);
                                iVar3 = name.field_2._12_4_;
                              } while (lVar12 == 0);
                              if (((local_410 != 0) && (local_410 != 2)) ||
                                 (lVar12 = std::__cxx11::string::find
                                                     (error.field_2._M_local_buf + 8,0x60f412),
                                 lVar12 != 0)) break;
                              local_410 = 1;
                              iVar7 = glm::max<int>(colorCompsFound,0);
                              vertexCoordsFound = iVar7 + 1;
                              std::__cxx11::string::substr
                                        ((ulong)&local_4d0,(ulong)((long)&error.field_2 + 8));
                              iVar7 = toInt(&local_4d0);
                              std::
                              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ::resize((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                        *)&normals.
                                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (long)iVar7);
                              std::__cxx11::string::~string((string *)&local_4d0);
                            }
                            if (((local_410 != 0) && (local_410 != 1)) ||
                               (lVar12 = std::__cxx11::string::find
                                                   (error.field_2._M_local_buf + 8,0x60f421),
                               lVar12 != 0)) break;
                            local_410 = 2;
                            iVar7 = glm::max<int>(vertexCoordsFound,0);
                            colorCompsFound = iVar7 + 1;
                            std::__cxx11::string::substr
                                      ((ulong)&local_4f0,(ulong)((long)&error.field_2 + 8));
                            iVar7 = toInt(&local_4f0);
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       local_4b0,(long)(iVar7 * 3));
                            std::__cxx11::string::~string((string *)&local_4f0);
                          }
                          if ((local_410 != 1) ||
                             (((lVar12 = std::__cxx11::string::find
                                                   (error.field_2._M_local_buf + 8,0x60f42e),
                               lVar12 != 0 &&
                               (lVar12 = std::__cxx11::string::find
                                                   (error.field_2._M_local_buf + 8,0x60f43f),
                               lVar12 != 0)) &&
                              (lVar12 = std::__cxx11::string::find
                                                  (error.field_2._M_local_buf + 8,0x60f450),
                              lVar12 != 0)))) break;
                          texCoordsFound = texCoordsFound + 1;
                        }
                        if ((local_410 != 1) ||
                           (((lVar12 = std::__cxx11::string::find
                                                 (error.field_2._M_local_buf + 8,0x60f461),
                             lVar12 != 0 &&
                             (lVar12 = std::__cxx11::string::find
                                                 (error.field_2._M_local_buf + 8,0x60f473),
                             lVar12 != 0)) &&
                            (lVar12 = std::__cxx11::string::find
                                                (error.field_2._M_local_buf + 8,0x60f485),
                            lVar12 != 0)))) break;
                        currentFace = currentFace + 1;
                        if (currentFace == 3) {
                          sVar17 = std::
                                   vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           *)&normals.
                                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          std::
                          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                          ::resize((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    *)&texcoord.
                                       super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar17);
                        }
                      }
                      if ((local_410 != 1) ||
                         (((lVar12 = std::__cxx11::string::find
                                               (error.field_2._M_local_buf + 8,0x60f497),
                           lVar12 != 0 &&
                           (lVar12 = std::__cxx11::string::find
                                               (error.field_2._M_local_buf + 8,0x60f4a8),
                           lVar12 != 0)) &&
                          ((lVar12 = std::__cxx11::string::find
                                               (error.field_2._M_local_buf + 8,0x60f4b9),
                           lVar12 != 0 &&
                           (lVar12 = std::__cxx11::string::find
                                               (error.field_2._M_local_buf + 8,0x60f4ca),
                           lVar12 != 0)))))) break;
                      normalsCoordsFound = normalsCoordsFound + 1;
                      sVar17 = std::
                               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                       *)&normals.
                                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      std::
                      vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                      ::resize((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                *)&vertices.
                                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar17);
                      bVar5 = true;
                    }
                    if ((local_410 != 1) ||
                       (((lVar12 = std::__cxx11::string::find
                                             (error.field_2._M_local_buf + 8,0x60f4db), lVar12 != 0
                         && (lVar12 = std::__cxx11::string::find
                                                (error.field_2._M_local_buf + 8,0x60f4ee),
                            lVar12 != 0)) &&
                        ((lVar12 = std::__cxx11::string::find
                                             (error.field_2._M_local_buf + 8,0x60f503), lVar12 != 0
                         && (lVar12 = std::__cxx11::string::find
                                                (error.field_2._M_local_buf + 8,0x60f517),
                            lVar12 != 0)))))) break;
                    normalsCoordsFound = normalsCoordsFound + 1;
                    sVar17 = std::
                             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     *)&normals.
                                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::
                    vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                    ::resize((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                              *)&vertices.
                                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar17);
                    bVar5 = false;
                  }
                  if ((local_410 != 1) ||
                     ((lVar12 = std::__cxx11::string::find(error.field_2._M_local_buf + 8,0x60f52c),
                      lVar12 != 0 &&
                      (lVar12 = std::__cxx11::string::find(error.field_2._M_local_buf + 8,0x60f53d),
                      lVar12 != 0)))) break;
                  currentVertex = currentVertex + 1;
                  sVar17 = std::
                           vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   *)&normals.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::
                  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ::resize((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                            *)&indices.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,sVar17);
                }
                if ((local_410 != 1) ||
                   ((lVar12 = std::__cxx11::string::find(error.field_2._M_local_buf + 8,0x60f54e),
                    lVar12 != 0 &&
                    (lVar12 = std::__cxx11::string::find(error.field_2._M_local_buf + 8,0x60f567),
                    lVar12 != 0)))) break;
                currentVertex = currentVertex + 1;
                sVar17 = std::
                         vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                 *)&normals.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                ::resize((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                          *)&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar17);
              }
              if (((local_410 == 2) &&
                  (lVar12 = std::__cxx11::string::find(error.field_2._M_local_buf + 8,0x60f580),
                  lVar12 != 0)) &&
                 (bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&error.field_2 + 8),"end_header"), bVar6)) {
                std::__cxx11::string::operator=((string *)&orderIndices,"wrong face definition");
                goto LAB_0058c737;
              }
              bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&error.field_2 + 8),"end_header");
              if (!bVar6) break;
              sVar17 = std::
                       vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                       ::size((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                               *)&vertices.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (((sVar17 != 0) && (normalsCoordsFound != 3)) && (normalsCoordsFound != 4)) {
                toString<int>(&local_550,&normalsCoordsFound);
                std::operator+(&local_530,
                               "data has color coordiantes but not correct number of components. Found "
                               ,&local_550);
                std::operator+(&local_510,&local_530," expecting 3 or 4");
                std::__cxx11::string::operator=((string *)&orderIndices,(string *)&local_510);
                std::__cxx11::string::~string((string *)&local_510);
                std::__cxx11::string::~string((string *)&local_530);
                std::__cxx11::string::~string((string *)&local_550);
                goto LAB_0058c737;
              }
              sVar17 = std::
                       vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               *)&texcoord.
                                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if ((sVar17 != 0) && (currentFace != 3)) {
                toString<int>(&local_5b0,&currentFace);
                std::operator+(&local_590,
                               "data has normal coordiantes but not correct number of components. Found "
                               ,&local_5b0);
                std::operator+(&local_570,&local_590," expecting 3");
                std::__cxx11::string::operator=((string *)&orderIndices,(string *)&local_570);
                std::__cxx11::string::~string((string *)&local_570);
                std::__cxx11::string::~string((string *)&local_590);
                std::__cxx11::string::~string((string *)&local_5b0);
                goto LAB_0058c737;
              }
              sVar17 = std::
                       vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               *)&normals.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (sVar17 == 0) {
                poVar19 = std::operator<<((ostream *)&std::cout,
                                          "ERROR glMesh, load(): mesh loaded from \"");
                poVar19 = std::operator<<(poVar19,(string *)_filename);
                poVar19 = std::operator<<(poVar19,"\" has no vertices");
                std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
              }
              if (vertexCoordsFound == -1) {
                vertexCoordsFound = 9999;
              }
              if (colorCompsFound == -1) {
                colorCompsFound = 9999;
              }
              if (vertexCoordsFound < colorCompsFound) {
                local_410 = 3;
              }
              else {
                local_410 = 5;
              }
            }
            if (local_410 != 3) break;
            std::__cxx11::stringstream::stringstream((stringstream *)&v.field_1);
            std::__cxx11::stringstream::str((string *)&v.field_1);
            std::istream::operator>>(&v.field_1,&n.field_1.y);
            std::istream::operator>>(&v.field_1,&n.field_2.z);
            if (2 < texCoordsFound) {
              std::istream::operator>>(&v.field_1,(float *)&v);
            }
            pvVar13 = std::
                      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    *)&normals.
                                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)(int)uStack_404);
            pvVar13->field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)n.field_1;
            pvVar13->field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)n.field_2;
            pvVar13->field_2 =
                 (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)v.field_0;
            if (0 < currentFace) {
              std::istream::operator>>(&v.field_1,&c.field_2.z);
              std::istream::operator>>(&v.field_1,&c.field_3.w);
              std::istream::operator>>(&v.field_1,(float *)&n);
              pvVar13 = std::
                        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      *)&texcoord.
                                         super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)(int)uStack_404);
              pvVar13->field_0 =
                   (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)c.field_2;
              pvVar13->field_1 =
                   (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)c.field_3;
              pvVar13->field_2 =
                   (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)n.field_0;
            }
            if (0 < normalsCoordsFound) {
              if (bVar5) {
                std::istream::operator>>(&v.field_1,&g);
                std::istream::operator>>(&v.field_1,&r);
                std::istream::operator>>(&v.field_1,(float *)&c);
                if (3 < normalsCoordsFound) {
                  std::istream::operator>>(&v.field_1,&c.field_1.y);
                }
                pvVar14 = std::
                          vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                          ::operator[]((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                        *)&vertices.
                                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (long)(int)uStack_404);
                pvVar14->field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)g
                ;
                pvVar14->field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)r
                ;
                pvVar14->field_2 =
                     (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)c.field_0;
                pvVar14->field_3 =
                     (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)c.field_1;
              }
              else {
                local_770 = 255.0;
                std::istream::operator>>(&v.field_1,&b);
                std::istream::operator>>(&v.field_1,&a);
                std::istream::operator>>(&v.field_1,&local_76c);
                if (3 < normalsCoordsFound) {
                  std::istream::operator>>(&v.field_1,&local_770);
                }
                glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>
                          ((vec<4,float,(glm::qualifier)0> *)&uv,(double)b / 255.0,(double)a / 255.0
                           ,(double)local_76c / 255.0,(double)local_770 / 255.0);
                pvVar14 = std::
                          vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                          ::operator[]((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                        *)&vertices.
                                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (long)(int)uStack_404);
                pvVar14->field_0 =
                     (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)uv.field_0;
                pvVar14->field_1 =
                     (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)uv.field_1;
                pvVar14->field_2 =
                     (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
                     (undefined4)local_778;
                pvVar14->field_3 =
                     (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_778._4_4_
                ;
              }
            }
            if (0 < currentVertex) {
              std::istream::operator>>(&v.field_1,(float *)&local_788);
              std::istream::operator>>(&v.field_1,&local_788.field_1.y);
              pvVar15 = std::
                        vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                        ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                      *)&indices.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)(int)uStack_404);
              *pvVar15 = local_788;
            }
            uStack_404 = uStack_404 + 1;
            sVar17 = std::
                     vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             *)&normals.
                                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (uStack_404 == sVar17) {
              if (vertexCoordsFound < colorCompsFound) {
                local_410 = 5;
              }
              else {
                local_410 = 3;
              }
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)&v.field_1);
          }
        } while ((local_410 != 5) ||
                (sVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     local_4b0), sVar17 == 0));
        std::__cxx11::stringstream::stringstream((stringstream *)&i);
        std::__cxx11::stringstream::str((string *)&i);
        std::istream::operator>>(&i,&local_914);
        if (local_914 == 3) {
          std::istream::operator>>(&i,(int *)&local_918);
          vVar2 = local_918;
          pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4b0,
                               (long)(int)(state * 3));
          *pvVar16 = vVar2;
          std::istream::operator>>(&i,(int *)&local_918);
          vVar2 = local_918;
          pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4b0,
                               (long)(int)(state * 3 + 1));
          *pvVar16 = vVar2;
          std::istream::operator>>(&i,(int *)&local_918);
          vVar2 = local_918;
          pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4b0,
                               (long)(int)(state * 3 + 2));
          *pvVar16 = vVar2;
          state = state + VertexDef;
          sVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4b0);
          if ((ulong)state == sVar17 / 3) {
            if (vertexCoordsFound < colorCompsFound) {
              local_410 = 3;
            }
            else {
              local_410 = 5;
            }
          }
          local_91c = 3;
        }
        else {
          std::__cxx11::string::operator=((string *)&orderIndices,"face not a triangle");
          local_91c = 2;
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&i);
        if (local_91c == 2) goto LAB_0058c737;
      } while (local_91c == 3);
    }
LAB_0058c82e:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4b0);
    std::
    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)&texcoord.
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)&normals.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ::~vector((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               *)&vertices.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &colors.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&orderIndices);
    std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
    Mesh::~Mesh((Mesh *)((long)&line.field_2 + 8));
    if (local_91c != 0) goto LAB_0058c983;
  }
  std::fstream::close();
  poVar19 = std::operator<<((ostream *)&std::cout,"ERROR glMesh, can not load  ");
  poVar19 = std::operator<<(poVar19,(string *)_filename);
  std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
  _filename_local._7_1_ = 0;
LAB_0058c983:
  std::fstream::~fstream(local_238);
  return (bool)(_filename_local._7_1_ & 1);
}

Assistant:

bool loadPLY(const std::string& _filename, Scene* _scene, bool _verbose) {    
    std::fstream is(_filename.c_str(), std::ios::in);
    if (is.is_open()) {

        if (_scene->materials.find("default") == _scene->materials.end())
            _scene->materials["default"] = new Material("default");
        
        Material* default_material = _scene->materials["default"];

        Mesh mesh;

        std::string line;
        std::string error;

        int orderVertices=-1;
        int orderIndices=-1;

        int vertexCoordsFound=0;
        int colorCompsFound=0;
        int texCoordsFound=0;
        int normalsCoordsFound=0;

        int currentVertex = 0;
        int currentFace = 0;

        bool floatColor = false;

        enum State{
            Header,
            VertexDef,
            FaceDef,
            Vertices,
            Normals,
            Faces
        };

        State state = Header;

        int lineNum = 0;

        std::string name;

        std::vector<glm::vec4> colors;
        std::vector<glm::vec3> vertices;
        std::vector<glm::vec3> normals;
        std::vector<glm::vec2> texcoord;
        std::vector<INDEX_TYPE> indices;

        std::getline(is,line);
        lineNum++;
        if (line!="ply") {
            error = "wrong format, expecting 'ply'";
            goto clean;
        }

        std::getline(is,line);
        lineNum++;
        if (line!="format ascii 1.0") {
            error = "wrong format, expecting 'format ascii 1.0'";
            goto clean;
        }

        while(std::getline(is,line)) {
            lineNum++;
            if (line.find("comment")==0) {
                continue;
            }

            if ((state==Header || state==FaceDef) && line.find("element vertex")==0) {
                state = VertexDef;
                orderVertices = glm::max(orderIndices, 0)+1;
                vertices.resize(toInt(line.substr(15)));
                continue;
            }

            if ((state==Header || state==VertexDef) && line.find("element face")==0) {
                state = FaceDef;
                orderIndices = glm::max(orderVertices, 0)+1;
                indices.resize(toInt(line.substr(13))*3);
                continue;
            }

            if (state==VertexDef && (line.find("property float x")==0 || line.find("property float y")==0 || line.find("property float z")==0)) {
                vertexCoordsFound++;
                continue;
            }

            if (state==VertexDef && (line.find("property float nx")==0 || line.find("property float ny")==0 || line.find("property float nz")==0)) {
                normalsCoordsFound++;
                if (normalsCoordsFound==3) normals.resize(vertices.size());
                continue;
            }

            if (state==VertexDef && (line.find("property float r")==0 || line.find("property float g")==0 || line.find("property float b")==0 || line.find("property float a")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = true;
                continue;
            }
            else if (state==VertexDef && (line.find("property uchar red")==0 || line.find("property uchar green")==0 || line.find("property uchar blue")==0 || line.find("property uchar alpha")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = false;
                continue;
            }

            if (state==VertexDef && (line.find("property float u")==0 || line.find("property float v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }
            else if (state==VertexDef && (line.find("property float texture_u")==0 || line.find("property float texture_v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }

            if (state==FaceDef && line.find("property list")!=0 && line!="end_header") {
                error = "wrong face definition";
                goto clean;
            }

            if (line=="end_header") {
                if (colors.size() && colorCompsFound!=3 && colorCompsFound!=4) {
                    error =  "data has color coordiantes but not correct number of components. Found " + toString(colorCompsFound) + " expecting 3 or 4";
                    goto clean;
                }
                if (normals.size() && normalsCoordsFound!=3) {
                    error = "data has normal coordiantes but not correct number of components. Found " + toString(normalsCoordsFound) + " expecting 3";
                    goto clean;
                }
                if (!vertices.size()) {
                    std::cout << "ERROR glMesh, load(): mesh loaded from \"" << _filename << "\" has no vertices" << std::endl;
                }
                if (orderVertices==-1) orderVertices=9999;
                if (orderIndices==-1) orderIndices=9999;

                if (orderVertices < orderIndices) {
                    state = Vertices;
                }
                else {
                    state = Faces;
                }
                continue;
            }

            if (state==Vertices) {
                std::stringstream sline;
                sline.str(line);
                glm::vec3 v;
                sline >> v.x;
                sline >> v.y;
                if ( vertexCoordsFound > 2) sline >> v.z;
                vertices[currentVertex] = v;

                if (normalsCoordsFound > 0) {
                    glm::vec3 n;
                    sline >> n.x;
                    sline >> n.y;
                    sline >> n.z;
                    normals[currentVertex] = n;
                }

                if (colorCompsFound > 0) {
                    if (floatColor) {
                        glm::vec4 c;
                        sline >> c.r;
                        sline >> c.g;
                        sline >> c.b;
                        if (colorCompsFound > 3) sline >> c.a;
                        colors[currentVertex] = c;
                    }
                    else {
                        float r, g, b, a = 255;
                        sline >> r;
                        sline >> g;
                        sline >> b;
                        if (colorCompsFound > 3) sline >> a;
                        colors[currentVertex] = glm::vec4(r/255.0, g/255.0, b/255.0, a/255.0);
                    }
                }

                if (texCoordsFound>0) {
                    glm::vec2 uv;
                    sline >> uv.x;
                    sline >> uv.y;
                    texcoord[currentVertex] = uv;
                }

                currentVertex++;
                if ((uint32_t)currentVertex==vertices.size()) {
                    if (orderVertices<orderIndices) {
                        state = Faces;
                    }
                    else{
                        state = Vertices;
                    }
                }
                continue;
            }

            if (state==Faces && indices.size() > 0) {
                std::stringstream sline;
                sline.str(line);
                int numV;
                sline >> numV;
                if (numV!=3) {
                    error = "face not a triangle";
                    goto clean;
                }
                int i;
                sline >> i;
                indices[currentFace*3] = i;
                sline >> i;
                indices[currentFace*3+1] = i;
                sline >> i;
                indices[currentFace*3+2] = i;

                currentFace++;
                if ((uint32_t)currentFace==indices.size()/3) {
                    if (orderVertices<orderIndices) {
                        state = Vertices;
                    }
                    else {
                        state = Faces;
                    }
                }
                continue;
            }
        }
        is.close();

        //  Succed loading the PLY data
        //  (proceed replacing the data on mesh)
        //
        mesh.addColors(colors);
        mesh.addVertices(vertices);
        mesh.addTexCoords(texcoord);

        if ( indices.size() > 0 ){
            mesh.addIndices( indices );
        }
        else {
            mesh.setDrawMode( POINTS );
        }
        
        if ( normals.size() > 0 ) {
            mesh.addNormals( normals );
        }
        else {
            mesh.computeNormals();
        }

        mesh.computeTangents();

        _scene->materials[default_material->name] = default_material;

        if (mesh.getDrawMode() == POINTS)
            name = "points";
        else if (mesh.getDrawMode() == LINES)
            name = "lines";
        else
            name = "mesh";
        _scene->models[name] = new Model(name, mesh, default_material);

        return true;

    clean:
        std::cout << "ERROR glMesh, load(): " << lineNum << ":" << error << std::endl;
        std::cout << "ERROR glMesh, load(): \"" << line << "\"" << std::endl;

    }

    is.close();
    std::cout << "ERROR glMesh, can not load  " << _filename << std::endl;

    return false;
}